

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O0

int fec_group_decode(fec_group_t *group)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  gf *pkts;
  long lVar4;
  int iVar5;
  fec_t *pfVar6;
  uint *puVar7;
  undefined8 uStack_50;
  uint *local_48 [2];
  fec_t *local_38;
  fec_t *fec;
  int j;
  int i;
  unsigned_long __vla_expr0;
  fec_group_t *local_18;
  fec_group_t *group_local;
  
  local_18 = group;
  if (group == (fec_group_t *)0x0) {
    uStack_50 = 0x10a824;
    __assert_fail("group != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x88,
                  "int fec_group_decode(fec_group_t *)");
  }
  if (group->decoded == 0) {
    if (group->rcvd_pkts < group->fec_k) {
      group_local._4_4_ = 0;
    }
    else {
      bVar1 = group->fec_k;
      lVar4 = -(ulong)((uint)bVar1 * 4 + 0xf & 0xfffffff0);
      puVar7 = (uint *)((long)local_48 + lVar4);
      fec._0_4_ = 0;
      for (fec._4_4_ = 0; (int)fec._4_4_ < (int)(uint)group->fec_n; fec._4_4_ = fec._4_4_ + 1) {
        if (group->lengths[(int)fec._4_4_] != 0) {
          puVar7[(int)(uint)fec] = fec._4_4_;
          fec._0_4_ = (uint)fec + 1;
          if ((uint)fec == group->fec_k) break;
        }
      }
      local_48[0] = puVar7;
      _j = (ulong)bVar1;
      if ((uint)fec != group->fec_k) {
        __vla_expr0 = (unsigned_long)local_48;
        *(undefined8 *)((long)local_48 + lVar4 + -8) = 0x10a914;
        __assert_fail("j == group->fec_k",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0x9f,"int fec_group_decode(fec_group_t *)");
      }
      bVar1 = group->fec_k;
      bVar2 = group->fec_n;
      __vla_expr0 = (unsigned_long)local_48;
      *(undefined8 *)((long)local_48 + lVar4 + -8) = 0x10a928;
      pfVar6 = fec_new((uint)bVar1,(uint)bVar2);
      puVar7 = local_48[0];
      local_38 = pfVar6;
      if (pfVar6 == (fec_t *)0x0) {
        *(undefined8 *)((long)local_48 + lVar4 + -8) = 0x10a954;
        __assert_fail("fec != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0xa3,"int fec_group_decode(fec_group_t *)");
      }
      pkts = local_18->buf;
      uVar3 = local_18->fec_len;
      *(undefined8 *)((long)local_48 + lVar4 + -8) = 0x10a971;
      iVar5 = fec_decode(pfVar6,pkts,puVar7,(uint)uVar3);
      pfVar6 = local_38;
      if (iVar5 != 0) {
        *(undefined8 *)((long)local_48 + lVar4 + -8) = 0x10a9b0;
        fec_free(pfVar6);
        local_18->decoded = 1;
      }
      else {
        *(undefined8 *)((long)local_48 + lVar4 + -8) = 0x10a98e;
        fprintf(_stderr,"Could not decode FEC group\n");
        pfVar6 = local_38;
        *(undefined8 *)((long)local_48 + lVar4 + -8) = 0x10a997;
        fec_free(pfVar6);
      }
      group_local._4_4_ = (uint)(iVar5 != 0);
    }
  }
  else {
    group_local._4_4_ = 1;
  }
  return group_local._4_4_;
}

Assistant:

int fec_group_decode(fec_group_t *group) {
  assert(group != NULL);
  
  if (group->decoded)
    return 1;
  
  /* check if enough packets in the group have been received to
   * recover the complete source data.
   */
  if (group->rcvd_pkts >= group->fec_k) {
    /* we have enough packets in the fec group */
    unsigned int idxs[group->fec_k];

    /* create index array and pointer array. */
    int i, j;
    for (i = 0, j = 0; i < group->fec_n; i++) {
      if (group->lengths[i] > 0) {
        idxs[j] = i;
        j++;
        if (j == group->fec_k)
          break;
      }
    }

    assert(j == group->fec_k);

    /* create the fec structure. */
    fec_t *fec = fec_new(group->fec_k, group->fec_n);
    assert(fec != NULL);

    /* decode the fec group. */
    if (!fec_decode(fec, group->buf, idxs, group->fec_len)) {
      fprintf(stderr, "Could not decode FEC group\n");
      fec_free(fec);
      return 0;
    }

    fec_free(fec);

    group->decoded = 1;

    return 1;
  }  else {
    return 0;
  }
}